

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O2

IterateResult __thiscall deqp::gls::LongStressCase::iterate(LongStressCase *this)

{
  Random *rnd;
  pointer puVar1;
  string *manglingSuffix;
  ostringstream *this_00;
  pointer *this_01;
  size_type *this_02;
  GLObjectManager<deqp::gls::LongStressCaseInternal::Texture> *pGVar2;
  pointer puVar3;
  pointer piVar4;
  DebugInfoRenderer *this_03;
  GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer> *pGVar5;
  bool bVar6;
  __type_conflict _Var7;
  int iVar8;
  int iVar9;
  deUint32 dVar10;
  deUint32 dVar11;
  uint uVar12;
  int iVar13;
  GLenum err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer source;
  deUint64 dVar14;
  Program *this_04;
  ulong uVar15;
  size_type __n;
  Texture *pTVar16;
  ulong uVar17;
  Buffer *pBVar18;
  undefined4 extraout_var_01;
  ulong uVar19;
  deUint64 dVar20;
  ostream *poVar21;
  MessageBuilder *this_05;
  TestLog *pTVar22;
  socklen_t __len;
  ulong uVar23;
  LongStressCase *__n_00;
  int precision;
  int precision_00;
  int precision_01;
  int precision_02;
  int precision_03;
  sockaddr *__addr;
  void *__buf;
  long lVar25;
  int i;
  pointer src;
  long lVar26;
  int i_2;
  TextureType *pTVar27;
  long lVar28;
  VarSpec *attrSpec;
  float fVar29;
  float fVar30;
  int progContextNdx;
  Program *local_eb8;
  float local_eac;
  float local_ea8;
  float local_ea4;
  float local_ea0;
  float local_e9c;
  float local_e98;
  float local_e94;
  string *local_e90;
  int *local_e88;
  ulong local_e80;
  vector<int,_std::allocator<int>_> *local_e78;
  vector<int,_std::allocator<int>_> *local_e70;
  GLsizei local_e68;
  GLsizei local_e64;
  TestLog *local_e60;
  string indexBufferName;
  string unitedAttrBufferNamePrefix;
  string programName;
  string textureNamePrefix;
  string separateAttrBufNamePrefix;
  Vec2 ab;
  ostringstream local_d80 [376];
  string local_c08;
  string local_be8;
  string local_bc8;
  string local_ba8;
  string local_b88 [32];
  string local_b68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b48;
  string local_b28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b08;
  string texName;
  vector<int,_std::allocator<int>_> texSpecIndices;
  LogSection local_7e8;
  undefined1 local_7a8 [8];
  ostream local_7a0;
  undefined1 local_628 [384];
  string local_4a8 [11];
  undefined1 local_330 [8];
  ostream local_328;
  undefined1 local_1b0 [384];
  Random *pRVar24;
  
  pTVar22 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar8 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  local_e64 = *(GLsizei *)CONCAT44(extraout_var,iVar8);
  iVar8 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  local_e68 = *(GLsizei *)(CONCAT44(extraout_var_00,iVar8) + 4);
  rnd = &this->m_rnd;
  local_ea0 = deRandom_getFloat(&rnd->m_rnd);
  local_ea4 = (this->m_probabilities).clientMemoryIndexData;
  local_e98 = deRandom_getFloat(&rnd->m_rnd);
  local_e9c = (this->m_probabilities).useDrawArrays;
  local_ea8 = deRandom_getFloat(&rnd->m_rnd);
  local_eac = (this->m_probabilities).separateAttributeBuffers;
  progContextNdx =
       de::Random::getInt(rnd,0,(int)(((long)(this->m_programContexts).
                                             super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->m_programContexts).
                                            super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                                            ._M_impl.super__Vector_impl_data._M_start) / 0xa8) + -1)
  ;
  source = (this->m_programContexts).
           super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
           ._M_impl.super__Vector_impl_data._M_start + progContextNdx;
  src = (this->m_programResources).
        super__Vector_base<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
        ._M_impl.super__Vector_impl_data._M_start + progContextNdx;
  de::toString<int>((string *)&ab,&progContextNdx);
  std::operator+(&programName,"prog",(string *)&ab);
  std::__cxx11::string::~string((string *)&ab);
  de::toString<int>(&texName,&progContextNdx);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ab,"tex",
                 &texName);
  std::operator+(&textureNamePrefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ab,"_");
  std::__cxx11::string::~string((string *)&ab);
  std::__cxx11::string::~string((string *)&texName);
  de::toString<int>(&texName,&progContextNdx);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ab,"attrBuf",
                 &texName);
  std::operator+(&unitedAttrBufferNamePrefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ab,"_");
  std::__cxx11::string::~string((string *)&ab);
  std::__cxx11::string::~string((string *)&texName);
  de::toString<int>((string *)&ab,&progContextNdx);
  std::operator+(&indexBufferName,"indexBuf",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ab);
  std::__cxx11::string::~string((string *)&ab);
  de::toString<int>(&texName,&progContextNdx);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ab,"attrBuf",
                 &texName);
  std::operator+(&separateAttrBufNamePrefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ab,"_");
  std::__cxx11::string::~string((string *)&ab);
  std::__cxx11::string::~string((string *)&texName);
  if (this->m_currentIteration == 0) {
    dVar14 = deGetTime();
    this->m_startTimeSeconds = dVar14;
    this->m_lastLogTime = dVar14;
  }
  local_e60 = pTVar22;
  bVar6 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Program>::has
                    (this->m_programs,&programName);
  if (!bVar6) {
    LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Program>::make
              (this->m_programs,&programName);
  }
  this_04 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Program>::get
                      (this->m_programs,&programName);
  local_e88 = &this->m_currentIteration;
  if ((!bVar6) ||
     (fVar29 = deRandom_getFloat(&rnd->m_rnd), fVar29 < (this->m_probabilities).rebuildProgram)) {
    iVar8 = *local_e88;
    dVar14 = deGetTime();
    uVar15 = (dVar14 ^ (long)iVar8) * 0x200000 + ~(dVar14 ^ (long)iVar8);
    uVar15 = (uVar15 >> 0x18 ^ uVar15) * 0x109;
    uVar15 = (uVar15 >> 0xe ^ uVar15) * 0x15;
    texName._M_dataplus._M_p._0_2_ = (ushort)(uVar15 >> 0x1c) ^ (ushort)uVar15;
    de::toString<unsigned_short>((string *)&ab,(unsigned_short *)&texName);
    manglingSuffix = &src->shaderNameManglingSuffix;
    std::__cxx11::string::operator=((string *)manglingSuffix,(string *)&ab);
    std::__cxx11::string::~string((string *)&ab);
    mangleShaderNames((string *)&ab,&source->vertexSource,manglingSuffix);
    mangleShaderNames(&texName,&source->fragmentSource,manglingSuffix);
    pTVar22 = local_e60;
    LongStressCaseInternal::Program::setSources(this_04,(string *)&ab,&texName);
    std::__cxx11::string::~string((string *)&texName);
    std::__cxx11::string::~string((string *)&ab);
    LongStressCaseInternal::Program::build(this_04,pTVar22);
  }
  LongStressCaseInternal::Program::use(this_04);
  local_eb8 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Program>::
              get(this->m_programs,&programName);
  iVar8 = 0;
  do {
    texSpecIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(texSpecIndices.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,iVar8);
    __n = ((long)(source->textureSpecs).
                 super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          *(long *)&(source->textureSpecs).
                    super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                    ._M_impl) / 0x50;
    if ((int)__n <= iVar8) {
      std::vector<int,_std::allocator<int>_>::vector(&texSpecIndices,__n,(allocator_type *)&ab);
      uVar17 = (ulong)((long)texSpecIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)texSpecIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2;
      uVar23 = 0;
      uVar15 = uVar17 & 0xffffffff;
      if ((int)uVar17 < 1) {
        uVar15 = uVar23;
      }
      for (; uVar15 != uVar23; uVar23 = uVar23 + 1) {
        texSpecIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar23] = (int)uVar23;
      }
      de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (rnd,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     texSpecIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 texSpecIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      lVar26 = 1;
      lVar25 = 0;
      for (lVar28 = 0;
          lVar28 < (int)((ulong)((long)texSpecIndices.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)texSpecIndices.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 2);
          lVar28 = lVar28 + 1) {
        pGVar2 = this->m_textures;
        de::toString<int>(&texName,(int *)((long)texSpecIndices.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start + lVar25))
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ab,
                       &textureNamePrefix,&texName);
        pTVar16 = LongStressCaseInternal::
                  GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>::get
                            (pGVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&ab);
        LongStressCaseInternal::Texture::toUnit
                  (pTVar16,*(int *)(*(long *)&(source->textureSpecs).
                                              super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                                              ._M_impl + lVar26 * 4));
        std::__cxx11::string::~string((string *)&ab);
        std::__cxx11::string::~string((string *)&texName);
        lVar25 = lVar25 + 4;
        lVar26 = lVar26 + 0x14;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&texSpecIndices.super__Vector_base<int,_std::allocator<int>_>);
      if ((local_e9c <= local_e98) &&
         (de::Random::
          shuffle<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
                    (rnd,(__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                          )(this->m_vertexIndices).
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                      )(this->m_vertexIndices).
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_finish), local_ea4 <= local_ea0)) {
        bVar6 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
                has(this->m_buffers,&indexBufferName);
        if (!bVar6) {
          LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::make
                    (this->m_buffers,&indexBufferName);
        }
        pBVar18 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>
                  ::get(this->m_buffers,&indexBufferName);
        if ((!bVar6) ||
           (fVar29 = deRandom_getFloat(&rnd->m_rnd), fVar29 < (this->m_probabilities).reuploadBuffer
           )) {
          LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
          removeGarbageUntilUnder
                    (this->m_buffers,
                     (pBVar18->m_dataSizeApprox + this->m_maxBufMemoryUsageBytes) -
                     (*(int *)&(this->m_vertexIndices).
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                      *(int *)&(this->m_vertexIndices).
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_start & 0xfffffffeU),rnd);
          fVar29 = deRandom_getFloat(&rnd->m_rnd);
          dVar10 = 0x8893;
          if (fVar29 < (this->m_probabilities).randomBufferUploadTarget) {
            dVar10 = randomBufferTarget(rnd,this->m_isGLES3);
          }
          if ((!bVar6) ||
             (fVar29 = deRandom_getFloat(&rnd->m_rnd),
             fVar29 < (this->m_probabilities).reuploadWithBufferData)) {
            fVar29 = deRandom_getFloat(&rnd->m_rnd);
            if ((this->m_probabilities).randomBufferUsage <= fVar29) {
              dVar11 = this->m_indexBufferUsage;
            }
            else {
              dVar11 = randomBufferUsage(rnd,this->m_isGLES3);
            }
            LongStressCaseInternal::Buffer::setData<unsigned_short>
                      (pBVar18,&this->m_vertexIndices,dVar10,dVar11);
          }
          else {
            LongStressCaseInternal::Buffer::setSubData<unsigned_short>
                      (pBVar18,&this->m_vertexIndices,0,this->m_numVerticesPerDrawCall,dVar10);
          }
        }
      }
      local_e80 = (ulong)(uint)this->m_numVerticesPerDrawCall;
      puVar3 = (src->attrDataBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((src->attrDataBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish != puVar3) {
        (src->attrDataBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_finish = puVar3;
      }
      local_e70 = &src->attrDataSizes;
      piVar4 = (src->attrDataOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((src->attrDataOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar4) {
        (src->attrDataOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar4;
      }
      std::vector<int,_std::allocator<int>_>::resize
                (local_e70,
                 ((long)(source->attributes).
                        super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(source->attributes).
                       super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>.
                       _M_impl.super__Vector_impl_data._M_start) / 0xa8);
      local_e78 = &src->attrDataOffsets;
      uVar17 = 0;
      uVar15 = 0;
      if (0 < (int)local_e80) {
        uVar15 = local_e80 & 0xffffffff;
      }
      uVar12 = (int)local_e80 - 2;
      uVar23 = (ulong)uVar12;
      if ((int)uVar12 < 1) {
        uVar23 = uVar17;
      }
      for (; lVar26 = (long)(source->attributes).
                            super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                            ._M_impl.super__Vector_impl_data._M_start,
          (long)uVar17 <
          (long)(int)(((long)(source->attributes).
                             super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                             ._M_impl.super__Vector_impl_data._M_finish - lVar26) / 0xa8);
          uVar17 = uVar17 + 1) {
        lVar25 = uVar17 * 0xa8;
        _Var7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(lVar26 + lVar25),&source->positionAttrName);
        if (_Var7) {
          piVar4 = (local_e70->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar26 = (long)(source->attributes).
                         super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          iVar8 = glu::getDataTypeScalarSize(*(DataType *)(lVar26 + lVar25 + 0x20));
          local_e90 = (string *)CONCAT44(extraout_var_01,iVar8);
          attrSpec = (VarSpec *)(lVar26 + lVar25);
          fVar29 = (float)generateRandomAttribData
                                    (&src->attrDataBuf,piVar4 + uVar17,attrSpec,(int)local_e80,rnd);
          iVar8 = (int)local_e90;
          local_e94 = fVar29;
          if (2 < iVar8) {
            puVar3 = (src->attrDataBuf).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar9 = 2;
            uVar19 = uVar15;
            while (bVar6 = uVar19 != 0, uVar19 = uVar19 - 1, bVar6) {
              puVar1 = puVar3 + (long)iVar9 * 4 + (long)(int)fVar29;
              puVar1[0] = '\0';
              puVar1[1] = '\0';
              puVar1[2] = 0x80;
              puVar1[3] = 0xbf;
              iVar9 = iVar9 + iVar8;
            }
            uVar19 = uVar23;
            iVar9 = 0;
            while (bVar6 = uVar19 != 0, uVar19 = uVar19 - 1, bVar6) {
              lVar26 = (long)iVar9;
              iVar13 = (int)local_e90 + iVar9;
              lVar25 = (long)iVar13;
              lVar28 = (long)(iVar8 * 2 + iVar9);
              texSpecIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   *(pointer *)(puVar3 + lVar26 * 4 + (long)(int)fVar29);
              local_628._0_8_ = *(float (*) [2])(puVar3 + lVar25 * 4 + (long)(int)fVar29);
              local_7a8 = *(undefined1 (*) [8])(puVar3 + lVar28 * 4 + (long)(int)fVar29);
              tcu::operator-((Vector<float,_2> *)local_628,(Vector<float,_2> *)&texSpecIndices);
              tcu::operator-((Vector<float,_2> *)local_7a8,(Vector<float,_2> *)&texSpecIndices);
              fVar30 = ab.m_data[0] * texName._M_dataplus._M_p._4_4_ -
                       texName._M_dataplus._M_p._0_4_ * ab.m_data[1];
              uVar12 = -(uint)(-fVar30 <= fVar30);
              fVar30 = (float)(~uVar12 & (uint)-fVar30 | (uint)fVar30 & uVar12) * 0.5;
              fVar30 = fVar30 / (fVar30 + 1.0);
              fVar30 = (1.0 - fVar30) * (attrSpec->minValue).f[2] +
                       fVar30 * (attrSpec->maxValue).f[2];
              uVar12 = -(uint)(fVar30 <= *(float *)(puVar3 + lVar26 * 4 + (long)(int)fVar29 + 8));
              *(uint *)(puVar3 + lVar26 * 4 + (long)(int)fVar29 + 8) =
                   uVar12 & (uint)*(float *)(puVar3 + lVar26 * 4 + (long)(int)fVar29 + 8) |
                   ~uVar12 & (uint)fVar30;
              uVar12 = -(uint)(fVar30 <= *(float *)(puVar3 + lVar25 * 4 + (long)(int)fVar29 + 8));
              *(uint *)(puVar3 + lVar25 * 4 + (long)(int)fVar29 + 8) =
                   uVar12 & (uint)*(float *)(puVar3 + lVar25 * 4 + (long)(int)fVar29 + 8) |
                   ~uVar12 & (uint)fVar30;
              uVar12 = -(uint)(fVar30 <= *(float *)(puVar3 + lVar28 * 4 + (long)(int)fVar29 + 8));
              *(uint *)(puVar3 + lVar28 * 4 + (long)(int)fVar29 + 8) =
                   uVar12 & (uint)*(float *)(puVar3 + lVar28 * 4 + (long)(int)fVar29 + 8) |
                   ~uVar12 & (uint)fVar30;
              iVar9 = iVar13;
            }
          }
          ab.m_data[0] = local_e94;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_e78,(int *)&ab);
        }
        else {
          fVar29 = (float)generateRandomAttribData
                                    (&src->attrDataBuf,
                                     (src->attrDataSizes).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start + uVar17,
                                     (VarSpec *)
                                     ((long)(source->attributes).
                                            super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar25),
                                     (int)local_e80,rnd);
          ab.m_data[0] = fVar29;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_e78,(int *)&ab);
        }
      }
      fVar29 = deRandom_getFloat(&rnd->m_rnd);
      if ((this->m_probabilities).clientMemoryAttributeData <= fVar29) {
        if (local_eac <= local_ea8) {
          iVar9 = 0;
          iVar8 = de::Random::getInt(rnd,0,this->m_redundantBufferFactor + -1);
          while( true ) {
            texSpecIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(texSpecIndices.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,iVar9);
            if (this->m_redundantBufferFactor <= iVar9) break;
            de::toString<int>(&texName,(int *)&texSpecIndices);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ab,
                           &unitedAttrBufferNamePrefix,&texName);
            std::__cxx11::string::~string((string *)&texName);
            bVar6 = LongStressCaseInternal::
                    GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::has
                              (this->m_buffers,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ab);
            if (!bVar6) {
              LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
              make(this->m_buffers,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ab);
            }
            pBVar18 = LongStressCaseInternal::
                      GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::get
                                (this->m_buffers,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ab);
            if ((!bVar6) ||
               (fVar29 = deRandom_getFloat(&rnd->m_rnd),
               fVar29 < (this->m_probabilities).reuploadBuffer)) {
              LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
              removeGarbageUntilUnder
                        (this->m_buffers,
                         pBVar18->m_dataSizeApprox + this->m_maxBufMemoryUsageBytes +
                         (*(int *)&(src->attrDataBuf).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start -
                         *(int *)&(src->attrDataBuf).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish),rnd);
              fVar29 = deRandom_getFloat(&rnd->m_rnd);
              dVar10 = 0x8892;
              if (fVar29 < (this->m_probabilities).randomBufferUploadTarget) {
                dVar10 = randomBufferTarget(rnd,this->m_isGLES3);
              }
              if ((!bVar6) ||
                 (fVar29 = deRandom_getFloat(&rnd->m_rnd),
                 fVar29 < (this->m_probabilities).reuploadWithBufferData)) {
                fVar29 = deRandom_getFloat(&rnd->m_rnd);
                if ((this->m_probabilities).randomBufferUsage <= fVar29) {
                  dVar11 = this->m_attrBufferUsage;
                }
                else {
                  dVar11 = randomBufferUsage(rnd,this->m_isGLES3);
                }
                LongStressCaseInternal::Buffer::setData<unsigned_char>
                          (pBVar18,&src->attrDataBuf,dVar10,dVar11);
              }
              else {
                LongStressCaseInternal::Buffer::setSubData<unsigned_char>
                          (pBVar18,&src->attrDataBuf,0,
                           *(int *)&(src->attrDataBuf).
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(src->attrDataBuf).
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,dVar10);
              }
            }
            if ((int)texSpecIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start == iVar8) {
              lVar26 = 0;
              for (lVar25 = 0;
                  lVar28 = (long)(source->attributes).
                                 super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                  lVar25 < (int)(((long)(source->attributes).
                                        super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - lVar28) / 0xa8)
                  ; lVar25 = lVar25 + 1) {
                LongStressCaseInternal::Program::setAttribute
                          (local_eb8,pBVar18,
                           (local_e78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start[lVar25],(VarSpec *)(lVar28 + lVar26),
                           &src->shaderNameManglingSuffix);
                lVar26 = lVar26 + 0xa8;
              }
            }
            std::__cxx11::string::~string((string *)&ab);
            iVar9 = (int)texSpecIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + 1;
          }
        }
        else {
          local_e90 = &src->shaderNameManglingSuffix;
          iVar8 = 0;
          while( true ) {
            local_1b0._0_4_ = iVar8;
            if ((int)(((long)(source->attributes).
                             super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(source->attributes).
                            super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0xa8) <= iVar8) break;
            iVar8 = de::Random::getInt(rnd,0,this->m_redundantBufferFactor + -1);
            iVar9 = 0;
            while( true ) {
              local_330._0_4_ = iVar9;
              if (this->m_redundantBufferFactor <= iVar9) break;
              de::toString<int>((string *)local_628,(int *)local_1b0);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &texSpecIndices,&separateAttrBufNamePrefix,(string *)local_628);
              std::operator+(&texName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&texSpecIndices,"_");
              de::toString<int>((string *)local_7a8,(int *)local_330);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ab,&texName,(string *)local_7a8);
              std::__cxx11::string::~string((string *)local_7a8);
              std::__cxx11::string::~string((string *)&texName);
              std::__cxx11::string::~string((string *)&texSpecIndices);
              std::__cxx11::string::~string((string *)local_628);
              bVar6 = LongStressCaseInternal::
                      GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::has
                                (this->m_buffers,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ab);
              if (!bVar6) {
                LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
                make(this->m_buffers,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ab);
              }
              pBVar18 = LongStressCaseInternal::
                        GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::get
                                  (this->m_buffers,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&ab);
              if ((!bVar6) ||
                 (fVar29 = deRandom_getFloat(&rnd->m_rnd),
                 fVar29 < (this->m_probabilities).reuploadBuffer)) {
                LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
                removeGarbageUntilUnder
                          (this->m_buffers,
                           (this->m_maxBufMemoryUsageBytes -
                           (local_e70->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start[(int)local_1b0._0_4_]) +
                           pBVar18->m_dataSizeApprox,rnd);
                fVar29 = deRandom_getFloat(&rnd->m_rnd);
                dVar10 = 0x8892;
                if (fVar29 < (this->m_probabilities).randomBufferUploadTarget) {
                  dVar10 = randomBufferTarget(rnd,this->m_isGLES3);
                }
                if ((!bVar6) ||
                   (fVar29 = deRandom_getFloat(&rnd->m_rnd),
                   fVar29 < (this->m_probabilities).reuploadWithBufferData)) {
                  iVar9 = (src->attrDataOffsets).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start[(int)local_1b0._0_4_];
                  puVar3 = (src->attrDataBuf).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
                  iVar13 = (src->attrDataSizes).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[(int)local_1b0._0_4_];
                  fVar29 = deRandom_getFloat(&rnd->m_rnd);
                  if ((this->m_probabilities).randomBufferUsage <= fVar29) {
                    dVar11 = this->m_attrBufferUsage;
                  }
                  else {
                    dVar11 = randomBufferUsage(rnd,this->m_isGLES3);
                  }
                  LongStressCaseInternal::Buffer::setData
                            (pBVar18,puVar3 + iVar9,iVar13,dVar10,dVar11);
                }
                else {
                  LongStressCaseInternal::Buffer::setSubData
                            (pBVar18,(src->attrDataBuf).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                                     (src->attrDataOffsets).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[(int)local_1b0._0_4_],0,
                             (src->attrDataSizes).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start[(int)local_1b0._0_4_],dVar10);
                }
              }
              if (local_330._0_4_ == iVar8) {
                LongStressCaseInternal::Program::setAttribute
                          (local_eb8,pBVar18,0,
                           (VarSpec *)
                           ((long)(source->attributes).
                                  super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                                  ._M_impl.super__Vector_impl_data._M_start +
                           (long)(int)local_1b0._0_4_ * 0xa8),local_e90);
              }
              std::__cxx11::string::~string((string *)&ab);
              iVar9 = local_330._0_4_ + 1;
            }
            iVar8 = local_1b0._0_4_ + 1;
          }
        }
      }
      else {
        lVar25 = 0;
        for (lVar26 = 0;
            lVar28 = (long)(source->attributes).
                           super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                           ._M_impl.super__Vector_impl_data._M_start,
            lVar26 < (int)(((long)(source->attributes).
                                  super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - lVar28) / 0xa8);
            lVar26 = lVar26 + 1) {
          LongStressCaseInternal::Program::setAttributeClientMem
                    (local_eb8,
                     (src->attrDataBuf).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start +
                     (src->attrDataOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar26],(VarSpec *)(lVar28 + lVar25),
                     &src->shaderNameManglingSuffix);
          lVar25 = lVar25 + 0xa8;
        }
      }
      glwViewport(0,0,local_e64,local_e68);
      glwClearDepthf(1.0);
      glwClear(0x100);
      glwEnable(0xb71);
      for (iVar8 = 0; iVar8 < this->m_numDrawCallsPerIteration; iVar8 = iVar8 + 1) {
        LongStressCaseInternal::Program::use(local_eb8);
        pRVar24 = rnd;
        LongStressCaseInternal::Program::setRandomUniforms
                  (local_eb8,&source->uniforms,&src->shaderNameManglingSuffix,rnd);
        __len = (socklen_t)pRVar24;
        if (local_e9c <= local_e98) {
          if (local_ea4 <= local_ea0) {
            pBVar18 = LongStressCaseInternal::
                      GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::get
                                (this->m_buffers,&indexBufferName);
            LongStressCaseInternal::Buffer::bind(pBVar18,0x8893,__addr,__len);
            glwDrawElements(5,this->m_numVerticesPerDrawCall,0x1403,(void *)0x0);
          }
          else {
            glwBindBuffer(0x8893,0);
            glwDrawElements(5,this->m_numVerticesPerDrawCall,0x1403,
                            (this->m_vertexIndices).
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          glwDrawArrays(5,0,this->m_numVerticesPerDrawCall);
        }
      }
      lVar26 = 0;
      for (lVar25 = 0;
          lVar28 = (long)(source->attributes).
                         super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                         ._M_impl.super__Vector_impl_data._M_start,
          lVar25 < (int)(((long)(source->attributes).
                                super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                                ._M_impl.super__Vector_impl_data._M_finish - lVar28) / 0xa8);
          lVar25 = lVar25 + 1) {
        LongStressCaseInternal::Program::disableAttributeArray
                  (local_eb8,(VarSpec *)(lVar28 + lVar26),&src->shaderNameManglingSuffix);
        lVar26 = lVar26 + 0xa8;
      }
      if (this->m_showDebugInfo != false) {
        this_03 = this->m_debugInfoRenderer;
        dVar20 = deGetTime();
        dVar14 = this->m_startTimeSeconds;
        iVar9 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>
                ::computeApproxMemUsage(this->m_textures);
        iVar8 = this->m_maxTexMemoryUsageBytes;
        iVar13 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>
                 ::computeApproxMemUsage(this->m_buffers);
        LongStressCaseInternal::DebugInfoRenderer::drawInfo
                  (this_03,dVar20 - dVar14,iVar9,iVar8,iVar13,this->m_maxBufMemoryUsageBytes,
                   this->m_currentIteration);
      }
      if (0 < *local_e88) {
        dVar14 = deGetTime();
        uVar15 = dVar14 - this->m_lastLogTime;
        iVar8 = this->m_currentIteration - this->m_lastLogIteration;
        __n_00 = this;
        if ((9 < uVar15) ||
           (uVar12 = this->m_numIterations - 1, __n_00 = (LongStressCase *)(ulong)uVar12,
           this->m_currentIteration == uVar12)) {
          de::toString<int>(&local_b28,&this->m_currentLogEntryNdx);
          std::operator+(&local_b08,"LogEntry",&local_b28);
          de::toString<int>(&local_b68,&this->m_currentLogEntryNdx);
          std::operator+(&local_b48,"Log entry ",&local_b68);
          tcu::LogSection::LogSection(&local_7e8,&local_b08,&local_b48);
          pTVar22 = local_e60;
          tcu::LogSection::write(&local_7e8,(int)local_e60,__buf,(size_t)__n_00);
          local_330 = (undefined1  [8])pTVar22;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
          std::operator<<(&local_328,"Time elapsed: ");
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
          poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)local_4a8);
          poVar21 = std::operator<<(poVar21,"d ");
          poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)poVar21);
          poVar21 = std::operator<<(poVar21,"h ");
          poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)poVar21);
          poVar21 = std::operator<<(poVar21,"m ");
          poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)poVar21);
          std::operator<<(poVar21,"s");
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
          std::operator<<(&local_328,local_b88);
          local_1b0._0_8_ =
               tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
          this_00 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::operator<<((ostream *)this_00,"Frame number: ");
          this_05 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,local_e88);
          local_7a8 = (undefined1  [8])
                      tcu::MessageBuilder::operator<<
                                (this_05,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7a0);
          std::operator<<(&local_7a0,"Time since last log entry: ");
          std::ostream::_M_insert<unsigned_long>((ulong)&local_7a0);
          std::operator<<(&local_7a0,"s");
          local_628._0_8_ =
               tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_7a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_628 + 8));
          std::operator<<((ostream *)(local_628 + 8),"Frames since last log entry: ");
          std::ostream::operator<<(local_628 + 8,iVar8);
          texSpecIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_628,
                                   (EndMessageToken *)&tcu::TestLog::EndMessage);
          this_01 = &texSpecIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
          std::operator<<((ostream *)this_01,"Average frame time since last log entry: ");
          de::floatToString_abi_cxx11_(local_4a8,(de *)0x2,(float)uVar15 / (float)iVar8,precision);
          std::operator<<((ostream *)this_01,(string *)local_4a8);
          std::operator<<((ostream *)this_01,"s");
          texName._M_dataplus._M_p =
               (pointer)tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)&texSpecIndices,
                                   (EndMessageToken *)&tcu::TestLog::EndMessage);
          this_02 = &texName._M_string_length;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)this_02);
          std::operator<<((ostream *)this_02,"Approximate texture memory usage: ");
          iVar8 = LongStressCaseInternal::
                  GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>::computeApproxMemUsage
                            (this->m_textures);
          de::floatToString_abi_cxx11_
                    (&local_ba8,(de *)0x2,(float)iVar8 * 9.536743e-07,precision_00);
          std::operator<<((ostream *)this_02,(string *)&local_ba8);
          std::operator<<((ostream *)this_02," MiB / ");
          de::floatToString_abi_cxx11_
                    (&local_bc8,(de *)0x2,(float)this->m_maxTexMemoryUsageBytes * 9.536743e-07,
                     precision_01);
          std::operator<<((ostream *)this_02,(string *)&local_bc8);
          std::operator<<((ostream *)this_02," MiB");
          ab.m_data = (float  [2])
                      tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)&texName,
                                 (EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::ostringstream(local_d80);
          std::operator<<((ostream *)local_d80,"Approximate buffer memory usage: ");
          iVar8 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>
                  ::computeApproxMemUsage(this->m_buffers);
          de::floatToString_abi_cxx11_
                    (&local_be8,(de *)0x2,(float)iVar8 * 9.536743e-07,precision_02);
          std::operator<<((ostream *)local_d80,(string *)&local_be8);
          std::operator<<((ostream *)local_d80," MiB / ");
          de::floatToString_abi_cxx11_
                    (&local_c08,(de *)0x2,(float)this->m_maxBufMemoryUsageBytes * 9.536743e-07,
                     precision_03);
          std::operator<<((ostream *)local_d80,(string *)&local_c08);
          std::operator<<((ostream *)local_d80," MiB");
          pTVar22 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)&ab,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::TestLog::endSection(pTVar22);
          std::__cxx11::string::~string((string *)&local_c08);
          std::__cxx11::string::~string((string *)&local_be8);
          std::__cxx11::ostringstream::~ostringstream(local_d80);
          std::__cxx11::string::~string((string *)&local_bc8);
          std::__cxx11::string::~string((string *)&local_ba8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_02);
          std::__cxx11::string::~string((string *)local_4a8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_628 + 8));
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_7a0);
          std::__cxx11::ostringstream::~ostringstream(this_00);
          std::__cxx11::string::~string(local_b88);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
          tcu::LogSection::~LogSection(&local_7e8);
          std::__cxx11::string::~string((string *)&local_b48);
          std::__cxx11::string::~string((string *)&local_b68);
          std::__cxx11::string::~string((string *)&local_b08);
          std::__cxx11::string::~string((string *)&local_b28);
          this->m_lastLogTime = dVar14;
          this->m_lastLogIteration = this->m_currentIteration;
          this->m_currentLogEntryNdx = this->m_currentLogEntryNdx + 1;
        }
      }
      iVar8 = 0;
      while( true ) {
        texSpecIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)CONCAT44(texSpecIndices.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,iVar8);
        if ((int)(((long)(source->textureSpecs).
                         super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  *(long *)&(source->textureSpecs).
                            super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                            ._M_impl) / 0x50) <= iVar8) break;
        de::toString<int>(&texName,(int *)&texSpecIndices);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ab,
                       &textureNamePrefix,&texName);
        std::__cxx11::string::~string((string *)&texName);
        fVar29 = deRandom_getFloat(&rnd->m_rnd);
        if ((this->m_probabilities).deleteTexture <= fVar29) {
          fVar29 = deRandom_getFloat(&rnd->m_rnd);
          if (fVar29 < (this->m_probabilities).wastefulTextureMemoryUsage) {
            LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>::
            markAsGarbage(this->m_textures,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ab);
          }
        }
        else {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>_>
          ::erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>_>
                   *)this->m_textures,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ab);
        }
        std::__cxx11::string::~string((string *)&ab);
        iVar8 = (int)texSpecIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
      }
      bVar6 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
              has(this->m_buffers,&indexBufferName);
      if (bVar6) {
        fVar29 = deRandom_getFloat(&rnd->m_rnd);
        if ((this->m_probabilities).deleteBuffer <= fVar29) {
          fVar29 = deRandom_getFloat(&rnd->m_rnd);
          if (fVar29 < (this->m_probabilities).wastefulBufferMemoryUsage) {
            LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
            markAsGarbage(this->m_buffers,&indexBufferName);
          }
        }
        else {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
          ::erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
                   *)this->m_buffers,&indexBufferName);
        }
      }
      if (local_eac <= local_ea8) {
        pGVar5 = this->m_buffers;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ab,
                       &unitedAttrBufferNamePrefix,"0");
        bVar6 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
                has(pGVar5,(string *)&ab);
        std::__cxx11::string::~string((string *)&ab);
        if (bVar6) {
          fVar29 = deRandom_getFloat(&rnd->m_rnd);
          if ((this->m_probabilities).deleteBuffer <= fVar29) {
            fVar29 = deRandom_getFloat(&rnd->m_rnd);
            if (fVar29 < (this->m_probabilities).wastefulBufferMemoryUsage) {
              iVar8 = 0;
              while( true ) {
                texSpecIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)CONCAT44(texSpecIndices.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,iVar8);
                if (this->m_redundantBufferFactor <= iVar8) break;
                pGVar5 = this->m_buffers;
                de::toString<int>(&texName,(int *)&texSpecIndices);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ab,&unitedAttrBufferNamePrefix,&texName);
                LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
                markAsGarbage(pGVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&ab);
                std::__cxx11::string::~string((string *)&ab);
                std::__cxx11::string::~string((string *)&texName);
                iVar8 = (int)texSpecIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + 1;
              }
            }
          }
          else {
            iVar8 = 0;
            while( true ) {
              texSpecIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(texSpecIndices.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,iVar8);
              if (this->m_redundantBufferFactor <= iVar8) break;
              pGVar5 = this->m_buffers;
              de::toString<int>(&texName,(int *)&texSpecIndices);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ab,&unitedAttrBufferNamePrefix,&texName);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
              ::erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
                       *)pGVar5,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ab);
              std::__cxx11::string::~string((string *)&ab);
              std::__cxx11::string::~string((string *)&texName);
              iVar8 = (int)texSpecIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + 1;
            }
          }
        }
      }
      else {
        fVar29 = 0.0;
        while( true ) {
          local_628._0_4_ = fVar29;
          if ((int)(((long)(source->attributes).
                           super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(source->attributes).
                          super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0xa8) <= (int)fVar29) break;
          de::toString<int>((string *)&texSpecIndices,(int *)local_628);
          std::operator+(&texName,&separateAttrBufNamePrefix,(string *)&texSpecIndices);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ab,
                         &texName,"_");
          std::__cxx11::string::~string((string *)&texName);
          std::__cxx11::string::~string((string *)&texSpecIndices);
          pGVar5 = this->m_buffers;
          std::operator+(&texName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&ab,"0");
          bVar6 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>
                  ::has(pGVar5,&texName);
          std::__cxx11::string::~string((string *)&texName);
          if (bVar6) {
            fVar29 = deRandom_getFloat(&rnd->m_rnd);
            if ((this->m_probabilities).deleteBuffer <= fVar29) {
              fVar29 = deRandom_getFloat(&rnd->m_rnd);
              if (fVar29 < (this->m_probabilities).wastefulBufferMemoryUsage) {
                fVar29 = 0.0;
                while( true ) {
                  local_7a8._0_4_ = fVar29;
                  if (this->m_redundantBufferFactor <= (int)fVar29) break;
                  pGVar5 = this->m_buffers;
                  de::toString<int>((string *)&texSpecIndices,(int *)local_7a8);
                  std::operator+(&texName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&ab,(string *)&texSpecIndices);
                  LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>
                  ::markAsGarbage(pGVar5,&texName);
                  std::__cxx11::string::~string((string *)&texName);
                  std::__cxx11::string::~string((string *)&texSpecIndices);
                  fVar29 = (float)(local_7a8._0_4_ + 1);
                }
              }
            }
            else {
              fVar29 = 0.0;
              while( true ) {
                local_7a8._0_4_ = fVar29;
                if (this->m_redundantBufferFactor <= (int)fVar29) break;
                pGVar5 = this->m_buffers;
                de::toString<int>((string *)&texSpecIndices,(int *)local_7a8);
                std::operator+(&texName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&ab,(string *)&texSpecIndices);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
                ::erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
                         *)pGVar5,&texName);
                std::__cxx11::string::~string((string *)&texName);
                std::__cxx11::string::~string((string *)&texSpecIndices);
                fVar29 = (float)(local_7a8._0_4_ + 1);
              }
            }
          }
          std::__cxx11::string::~string((string *)&ab);
          fVar29 = (float)(local_628._0_4_ + 1);
        }
      }
      err = glwGetError();
      glu::checkError(err,"End of LongStressCase::iterate()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLongStressCase.cpp"
                      ,0x625);
      iVar8 = this->m_currentIteration + 1;
      this->m_currentIteration = iVar8;
      bVar6 = iVar8 != this->m_numIterations;
      if (!bVar6) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Passed");
      }
      std::__cxx11::string::~string((string *)&separateAttrBufNamePrefix);
      std::__cxx11::string::~string((string *)&indexBufferName);
      std::__cxx11::string::~string((string *)&unitedAttrBufferNamePrefix);
      std::__cxx11::string::~string((string *)&textureNamePrefix);
      std::__cxx11::string::~string((string *)&programName);
      return (uint)bVar6;
    }
    de::toString<int>((string *)&ab,(int *)&texSpecIndices);
    std::operator+(&texName,&textureNamePrefix,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ab);
    std::__cxx11::string::~string((string *)&ab);
    bVar6 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>::has
                      (this->m_textures,&texName);
    pTVar27 = (TextureType *)
              ((long)(int)texSpecIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start * 0x50 +
              *(long *)&(source->textureSpecs).
                        super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                        ._M_impl);
    if (bVar6) {
      fVar29 = deRandom_getFloat(&rnd->m_rnd);
      if (fVar29 < (this->m_probabilities).reuploadTexture) goto LAB_014b5a9e;
    }
    else {
      LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>::make
                (this->m_textures,&texName,*pTVar27);
LAB_014b5a9e:
      pTVar16 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>
                ::get(this->m_textures,&texName);
      pGVar2 = this->m_textures;
      iVar8 = this->m_maxTexMemoryUsageBytes;
      iVar9 = LongStressCaseInternal::Texture::getApproxMemUsageDiff
                        (pTVar16,pTVar27[2],pTVar27[3],pTVar27[6],SUB41(pTVar27[7],0));
      LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>::
      removeGarbageUntilUnder(pGVar2,iVar8 - iVar9,rnd);
      if ((!bVar6) ||
         (fVar29 = deRandom_getFloat(&rnd->m_rnd),
         fVar29 < (this->m_probabilities).reuploadWithTexImage)) {
        tcu::TextureLevel::getAccess
                  ((PixelBufferAccess *)&ab,
                   (src->dummyTextures).
                   super__Vector_base<de::SharedPtr<tcu::TextureLevel>,_std::allocator<de::SharedPtr<tcu::TextureLevel>_>_>
                   ._M_impl.super__Vector_impl_data._M_start
                   [(int)texSpecIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start].m_ptr);
        LongStressCaseInternal::Texture::setData
                  (pTVar16,(ConstPixelBufferAccess *)&ab,pTVar27[2],pTVar27[3],pTVar27[6],
                   SUB41(pTVar27[7],0));
      }
      else {
        tcu::TextureLevel::getAccess
                  ((PixelBufferAccess *)&ab,
                   (src->dummyTextures).
                   super__Vector_base<de::SharedPtr<tcu::TextureLevel>,_std::allocator<de::SharedPtr<tcu::TextureLevel>_>_>
                   ._M_impl.super__Vector_impl_data._M_start
                   [(int)texSpecIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start].m_ptr);
        LongStressCaseInternal::Texture::setSubData
                  (pTVar16,(ConstPixelBufferAccess *)&ab,0,0,pTVar27[2],pTVar27[3]);
      }
      LongStressCaseInternal::Texture::toUnit(pTVar16,0);
      LongStressCaseInternal::Texture::setWrap(pTVar16,pTVar27[10],pTVar27[0xb]);
      LongStressCaseInternal::Texture::setFilter(pTVar16,pTVar27[8],pTVar27[9]);
    }
    std::__cxx11::string::~string((string *)&texName);
    iVar8 = (int)texSpecIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
  } while( true );
}

Assistant:

LongStressCase::IterateResult LongStressCase::iterate (void)
{
	TestLog&					log							= m_testCtx.getLog();
	const int					renderWidth					= m_renderCtx.getRenderTarget().getWidth();
	const int					renderHeight				= m_renderCtx.getRenderTarget().getHeight();
	const bool					useClientMemoryIndexData	= m_rnd.getFloat() < m_probabilities.clientMemoryIndexData;
	const bool					useDrawArrays				= m_rnd.getFloat() < m_probabilities.useDrawArrays;
	const bool					separateAttributeBuffers	= m_rnd.getFloat() < m_probabilities.separateAttributeBuffers;
	const int					progContextNdx				= m_rnd.getInt(0, (int)m_programContexts.size()-1);
	const ProgramContext&		programContext				= m_programContexts[progContextNdx];
	ProgramResources&			programResources			= m_programResources[progContextNdx];
	const string				programName					= "prog" + toString(progContextNdx);
	const string				textureNamePrefix			= "tex" + toString(progContextNdx) + "_";
	const string				unitedAttrBufferNamePrefix	= "attrBuf" + toString(progContextNdx) + "_";
	const string				indexBufferName				= "indexBuf" + toString(progContextNdx);
	const string				separateAttrBufNamePrefix	= "attrBuf" + toString(progContextNdx) + "_";

	if (m_currentIteration == 0)
		m_lastLogTime = m_startTimeSeconds = deGetTime();

	// Make or re-compile programs.
	{
		const bool hadProgram = m_programs->has(programName);

		if (!hadProgram)
			m_programs->make(programName);

		Program& prog = m_programs->get(programName);

		if (!hadProgram || m_rnd.getFloat() < m_probabilities.rebuildProgram)
		{
			programResources.shaderNameManglingSuffix = toString((deUint16)deUint64Hash((deUint64)m_currentIteration ^ deGetTime()));

			prog.setSources(mangleShaderNames(programContext.vertexSource, programResources.shaderNameManglingSuffix),
							mangleShaderNames(programContext.fragmentSource, programResources.shaderNameManglingSuffix));

			prog.build(log);
		}

		prog.use();
	}

	Program& program = m_programs->get(programName);

	// Make or re-upload textures.

	for (int texNdx = 0; texNdx < (int)programContext.textureSpecs.size(); texNdx++)
	{
		const string		texName		= textureNamePrefix + toString(texNdx);
		const bool			hadTexture	= m_textures->has(texName);
		const TextureSpec&	spec		= programContext.textureSpecs[texNdx];

		if (!hadTexture)
			m_textures->make(texName, spec.textureType);

		if (!hadTexture || m_rnd.getFloat() < m_probabilities.reuploadTexture)
		{
			Texture& texture = m_textures->get(texName);

			m_textures->removeGarbageUntilUnder(m_maxTexMemoryUsageBytes - texture.getApproxMemUsageDiff(spec.width, spec.height, spec.internalFormat, spec.useMipmap), m_rnd);

			if (!hadTexture || m_rnd.getFloat() < m_probabilities.reuploadWithTexImage)
				texture.setData(programResources.dummyTextures[texNdx]->getAccess(), spec.width, spec.height, spec.internalFormat, spec.useMipmap);
			else
				texture.setSubData(programResources.dummyTextures[texNdx]->getAccess(), 0, 0, spec.width, spec.height);

			texture.toUnit(0);
			texture.setWrap(spec.sWrap, spec.tWrap);
			texture.setFilter(spec.minFilter, spec.magFilter);
		}
	}

	// Bind textures to units, in random order (because when multiple texture specs have same unit, we want to pick one randomly).

	{
		vector<int> texSpecIndices(programContext.textureSpecs.size());
		for (int i = 0; i < (int)texSpecIndices.size(); i++)
			texSpecIndices[i] = i;
		m_rnd.shuffle(texSpecIndices.begin(), texSpecIndices.end());
		for (int i = 0; i < (int)texSpecIndices.size(); i++)
			m_textures->get(textureNamePrefix + toString(texSpecIndices[i])).toUnit(programContext.textureSpecs[i].textureUnit);
	}

	// Make or re-upload index buffer.

	if (!useDrawArrays)
	{
		m_rnd.shuffle(m_vertexIndices.begin(), m_vertexIndices.end());

		if (!useClientMemoryIndexData)
		{
			const bool hadIndexBuffer = m_buffers->has(indexBufferName);

			if (!hadIndexBuffer)
				m_buffers->make(indexBufferName);

			Buffer& indexBuf = m_buffers->get(indexBufferName);

			if (!hadIndexBuffer || m_rnd.getFloat() < m_probabilities.reuploadBuffer)
			{
				m_buffers->removeGarbageUntilUnder(m_maxBufMemoryUsageBytes - indexBuf.getApproxMemUsageDiff(m_vertexIndices), m_rnd);
				const deUint32 target = m_rnd.getFloat() < m_probabilities.randomBufferUploadTarget ? randomBufferTarget(m_rnd, m_isGLES3) : GL_ELEMENT_ARRAY_BUFFER;

				if (!hadIndexBuffer || m_rnd.getFloat() < m_probabilities.reuploadWithBufferData)
					indexBuf.setData(m_vertexIndices, target, m_rnd.getFloat() < m_probabilities.randomBufferUsage ? randomBufferUsage(m_rnd, m_isGLES3) : m_indexBufferUsage);
				else
					indexBuf.setSubData(m_vertexIndices, 0, m_numVerticesPerDrawCall, target);
			}
		}
	}

	// Set vertex attributes. If not using client-memory data, make or re-upload attribute buffers.

	generateAttribs(programResources.attrDataBuf, programResources.attrDataOffsets, programResources.attrDataSizes,
					programContext.attributes, programContext.positionAttrName, m_numVerticesPerDrawCall, m_rnd);

	if (!(m_rnd.getFloat() < m_probabilities.clientMemoryAttributeData))
	{
		if (separateAttributeBuffers)
		{
			for (int attrNdx = 0; attrNdx < (int)programContext.attributes.size(); attrNdx++)
			{
				const int usedRedundantBufferNdx = m_rnd.getInt(0, m_redundantBufferFactor-1);

				for (int redundantBufferNdx = 0; redundantBufferNdx < m_redundantBufferFactor; redundantBufferNdx++)
				{
					const string	curAttrBufName		= separateAttrBufNamePrefix + toString(attrNdx) + "_" + toString(redundantBufferNdx);
					const bool		hadCurAttrBuffer	= m_buffers->has(curAttrBufName);

					if (!hadCurAttrBuffer)
						m_buffers->make(curAttrBufName);

					Buffer& curAttrBuf = m_buffers->get(curAttrBufName);

					if (!hadCurAttrBuffer || m_rnd.getFloat() < m_probabilities.reuploadBuffer)
					{
						m_buffers->removeGarbageUntilUnder(m_maxBufMemoryUsageBytes - curAttrBuf.getApproxMemUsageDiff(programResources.attrDataSizes[attrNdx]), m_rnd);
						const deUint32 target = m_rnd.getFloat() < m_probabilities.randomBufferUploadTarget ? randomBufferTarget(m_rnd, m_isGLES3) : GL_ARRAY_BUFFER;

						if (!hadCurAttrBuffer || m_rnd.getFloat() < m_probabilities.reuploadWithBufferData)
							curAttrBuf.setData(&programResources.attrDataBuf[programResources.attrDataOffsets[attrNdx]], programResources.attrDataSizes[attrNdx], target,
											   m_rnd.getFloat() < m_probabilities.randomBufferUsage ? randomBufferUsage(m_rnd, m_isGLES3) : m_attrBufferUsage);
						else
							curAttrBuf.setSubData(&programResources.attrDataBuf[programResources.attrDataOffsets[attrNdx]], 0, programResources.attrDataSizes[attrNdx], target);
					}

					if (redundantBufferNdx == usedRedundantBufferNdx)
						program.setAttribute(curAttrBuf, 0, programContext.attributes[attrNdx], programResources.shaderNameManglingSuffix);
				}
			}
		}
		else
		{
			const int usedRedundantBufferNdx = m_rnd.getInt(0, m_redundantBufferFactor-1);

			for (int redundantBufferNdx = 0; redundantBufferNdx < m_redundantBufferFactor; redundantBufferNdx++)
			{
				const string	attrBufName		= unitedAttrBufferNamePrefix + toString(redundantBufferNdx);
				const bool		hadAttrBuffer	= m_buffers->has(attrBufName);

				if (!hadAttrBuffer)
					m_buffers->make(attrBufName);

				Buffer& attrBuf = m_buffers->get(attrBufName);

				if (!hadAttrBuffer || m_rnd.getFloat() < m_probabilities.reuploadBuffer)
				{
					m_buffers->removeGarbageUntilUnder(m_maxBufMemoryUsageBytes - attrBuf.getApproxMemUsageDiff(programResources.attrDataBuf), m_rnd);
					const deUint32 target = m_rnd.getFloat() < m_probabilities.randomBufferUploadTarget ? randomBufferTarget(m_rnd, m_isGLES3) : GL_ARRAY_BUFFER;

					if (!hadAttrBuffer || m_rnd.getFloat() < m_probabilities.reuploadWithBufferData)
						attrBuf.setData(programResources.attrDataBuf, target, m_rnd.getFloat() < m_probabilities.randomBufferUsage ? randomBufferUsage(m_rnd, m_isGLES3) : m_attrBufferUsage);
					else
						attrBuf.setSubData(programResources.attrDataBuf, 0, (int)programResources.attrDataBuf.size(), target);
				}

				if (redundantBufferNdx == usedRedundantBufferNdx)
				{
					for (int i = 0; i < (int)programContext.attributes.size(); i++)
						program.setAttribute(attrBuf, programResources.attrDataOffsets[i], programContext.attributes[i], programResources.shaderNameManglingSuffix);
				}
			}
		}
	}
	else
	{
		for (int i = 0; i < (int)programContext.attributes.size(); i++)
			program.setAttributeClientMem(&programResources.attrDataBuf[programResources.attrDataOffsets[i]], programContext.attributes[i], programResources.shaderNameManglingSuffix);
	}

	// Draw.

	glViewport(0, 0, renderWidth, renderHeight);

	glClearDepthf(1.0f);
	glClear(GL_DEPTH_BUFFER_BIT);
	glEnable(GL_DEPTH_TEST);

	for (int i = 0; i < m_numDrawCallsPerIteration; i++)
	{
		program.use();
		program.setRandomUniforms(programContext.uniforms, programResources.shaderNameManglingSuffix, m_rnd);

		if (useDrawArrays)
			glDrawArrays(GL_TRIANGLE_STRIP, 0, m_numVerticesPerDrawCall);
		else
		{
			if (useClientMemoryIndexData)
			{
				glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
				glDrawElements(GL_TRIANGLE_STRIP, m_numVerticesPerDrawCall, GL_UNSIGNED_SHORT, &m_vertexIndices[0]);
			}
			else
			{
				m_buffers->get(indexBufferName).bind(GL_ELEMENT_ARRAY_BUFFER);
				glDrawElements(GL_TRIANGLE_STRIP, m_numVerticesPerDrawCall, GL_UNSIGNED_SHORT, DE_NULL);
			}
		}
	}

	for(int i = 0; i < (int)programContext.attributes.size(); i++)
		program.disableAttributeArray(programContext.attributes[i], programResources.shaderNameManglingSuffix);

	if (m_showDebugInfo)
		m_debugInfoRenderer->drawInfo(deGetTime()-m_startTimeSeconds, m_textures->computeApproxMemUsage(), m_maxTexMemoryUsageBytes, m_buffers->computeApproxMemUsage(), m_maxBufMemoryUsageBytes, m_currentIteration);

	if (m_currentIteration > 0)
	{
		// Log if a certain amount of time has passed since last log entry (or if this is the last iteration).

		const deUint64	loggingIntervalSeconds	= 10;
		const deUint64	time					= deGetTime();
		const deUint64	timeDiff				= time - m_lastLogTime;
		const int		iterDiff				= m_currentIteration - m_lastLogIteration;

		if (timeDiff >= loggingIntervalSeconds || m_currentIteration == m_numIterations-1)
		{
			log << TestLog::Section("LogEntry" + toString(m_currentLogEntryNdx), "Log entry " + toString(m_currentLogEntryNdx))
				<< TestLog::Message << "Time elapsed: " << getTimeStr(time - m_startTimeSeconds) << TestLog::EndMessage
				<< TestLog::Message << "Frame number: " << m_currentIteration << TestLog::EndMessage
				<< TestLog::Message << "Time since last log entry: " << timeDiff << "s" << TestLog::EndMessage
				<< TestLog::Message << "Frames since last log entry: " << iterDiff << TestLog::EndMessage
				<< TestLog::Message << "Average frame time since last log entry: " << de::floatToString((float)timeDiff / (float)iterDiff, 2) << "s" << TestLog::EndMessage
				<< TestLog::Message << "Approximate texture memory usage: "
									<< de::floatToString((float)m_textures->computeApproxMemUsage() / Mi, 2) << " MiB / "
									<< de::floatToString((float)m_maxTexMemoryUsageBytes / Mi, 2) << " MiB"
									<< TestLog::EndMessage
				<< TestLog::Message << "Approximate buffer memory usage: "
										<< de::floatToString((float)m_buffers->computeApproxMemUsage() / Mi, 2) << " MiB / "
										<< de::floatToString((float)m_maxBufMemoryUsageBytes / Mi, 2) << " MiB"
										<< TestLog::EndMessage
				<< TestLog::EndSection;

			m_lastLogTime		= time;
			m_lastLogIteration	= m_currentIteration;
			m_currentLogEntryNdx++;
		}
	}

	// Possibly remove or set-as-garbage some objects, depending on given probabilities.

	for (int texNdx = 0; texNdx < (int)programContext.textureSpecs.size(); texNdx++)
	{
		const string texName = textureNamePrefix + toString(texNdx);
		if (m_rnd.getFloat() < m_probabilities.deleteTexture)
			m_textures->remove(texName);
		else if (m_rnd.getFloat() < m_probabilities.wastefulTextureMemoryUsage)
			m_textures->markAsGarbage(texName);

	}

	if (m_buffers->has(indexBufferName))
	{
		if (m_rnd.getFloat() < m_probabilities.deleteBuffer)
			m_buffers->remove(indexBufferName);
		else if (m_rnd.getFloat() < m_probabilities.wastefulBufferMemoryUsage)
			m_buffers->markAsGarbage(indexBufferName);

	}

	if (separateAttributeBuffers)
	{
		for (int attrNdx = 0; attrNdx < (int)programContext.attributes.size(); attrNdx++)
		{
			const string curAttrBufNamePrefix = separateAttrBufNamePrefix + toString(attrNdx) + "_";

			if (m_buffers->has(curAttrBufNamePrefix + "0"))
			{
				if (m_rnd.getFloat() < m_probabilities.deleteBuffer)
				{
					for (int i = 0; i < m_redundantBufferFactor; i++)
						m_buffers->remove(curAttrBufNamePrefix + toString(i));
				}
				else if (m_rnd.getFloat() < m_probabilities.wastefulBufferMemoryUsage)
				{
					for (int i = 0; i < m_redundantBufferFactor; i++)
						m_buffers->markAsGarbage(curAttrBufNamePrefix + toString(i));
				}
			}
		}
	}
	else
	{
		if (m_buffers->has(unitedAttrBufferNamePrefix + "0"))
		{
			if (m_rnd.getFloat() < m_probabilities.deleteBuffer)
			{
				for (int i = 0; i < m_redundantBufferFactor; i++)
					m_buffers->remove(unitedAttrBufferNamePrefix + toString(i));
			}
			else if (m_rnd.getFloat() < m_probabilities.wastefulBufferMemoryUsage)
			{
				for (int i = 0; i < m_redundantBufferFactor; i++)
					m_buffers->markAsGarbage(unitedAttrBufferNamePrefix + toString(i));
			}
		}
	}

	GLU_CHECK_MSG("End of LongStressCase::iterate()");

	m_currentIteration++;
	if (m_currentIteration == m_numIterations)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Passed");
		return STOP;
	}
	else
		return CONTINUE;
}